

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_map.cc
# Opt level: O2

void __thiscall
bloaty::sourcemap::SourceMapObjectFile::ProcessFileToSink(SourceMapObjectFile *this,RangeSink *sink)

{
  char cVar1;
  InputFile *pIVar2;
  int32_t iVar3;
  size_t sVar4;
  int iVar5;
  int32_t iVar6;
  char *pcVar7;
  int32_t col;
  bool bVar8;
  string_view source_file;
  string_view local_c8;
  int local_b4;
  int local_b0;
  int local_ac;
  int32_t values [5];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  sources;
  undefined1 local_60 [48];
  
  if (1 < sink->data_source_ - kCompileUnits) {
    Throw("Source map doesn\'t support this data source",0xdb);
  }
  pIVar2 = (this->super_ObjectFile).file_data_._M_t.
           super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
           super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
           super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
  local_c8._M_len = (pIVar2->data_)._M_len;
  local_c8._M_str = (pIVar2->data_)._M_str;
  ReadOpeningBrace(&local_c8);
  sources.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sources.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FindField(&local_c8,"sources");
  RequireChar(&local_c8,'[');
  do {
    if ((local_c8._M_len == 0) || (SkipWhitespace(&local_c8), local_c8._M_len == 0))
    goto LAB_0018e77f;
    if (*local_c8._M_str == ',') {
      local_c8._M_str = local_c8._M_str + 1;
      local_c8._M_len = local_c8._M_len - 1;
    }
    else if (*local_c8._M_str == ']') {
      local_c8._M_str = local_c8._M_str + 1;
      local_c8._M_len = local_c8._M_len - 1;
LAB_0018e77f:
      SkipWhitespace(&local_c8);
      RequireChar(&local_c8,',');
      FindField(&local_c8,"mappings");
      RequireChar(&local_c8,'\"');
      if ((local_c8._M_len == 0) || (*local_c8._M_str == '\"')) {
LAB_0018e7c6:
        RequireChar(&local_c8,'\"');
        std::
        _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::~_Vector_base(&sources.
                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       );
        return;
      }
      iVar5 = ReadBase64VLQSegment(&local_c8,&values);
      if (iVar5 < 4) {
        iVar5 = 0x95;
        pcVar7 = "Source file info expected in first VLQ segment";
LAB_0018e920:
        Throw(pcVar7,iVar5);
      }
      local_b0 = values[2];
      local_b4 = values[3];
      col = values[0];
      iVar6 = values[1];
      do {
        bVar8 = true;
        local_ac = iVar6;
        do {
          sVar4 = local_c8._M_len;
          pcVar7 = local_c8._M_str;
          do {
            local_c8._M_str = pcVar7;
            local_c8._M_len = sVar4;
            if (local_c8._M_len - 1 == 0xffffffffffffffff) goto LAB_0018e7c6;
            cVar1 = *local_c8._M_str;
            sVar4 = local_c8._M_len - 1;
            pcVar7 = local_c8._M_str + 1;
          } while (cVar1 == ',');
          if (cVar1 == '\"') goto LAB_0018e7c6;
          if (cVar1 == ';') {
            iVar5 = 0xa4;
            pcVar7 = "Unsupported line separator in source map";
            goto LAB_0018e920;
          }
          iVar5 = ReadBase64VLQSegment(&local_c8,&values);
          iVar3 = values[0];
          if (bVar8) {
            source_file._M_str =
                 sources.
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar6]._M_str;
            source_file._M_len =
                 sources.
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar6]._M_len;
            VlqSegment::VlqSegment
                      ((VlqSegment *)local_60,col,values[0],source_file,local_b0,local_b4);
            VlqSegment::addToSink((VlqSegment *)local_60,sink);
            std::__cxx11::string::~string((string *)(local_60 + 8));
          }
          col = iVar3 + col;
          bVar8 = false;
        } while (iVar5 < 4);
        iVar6 = local_ac + values[1];
        local_b0 = local_b0 + values[2];
        local_b4 = local_b4 + values[3];
      } while( true );
    }
    local_60._0_16_ = (undefined1  [16])ReadQuotedString(&local_c8);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::push_back(&sources,(value_type *)local_60);
  } while( true );
}

Assistant:

void addToSink(RangeSink* sink) const {
    auto name = sink->data_source() == DataSource::kInlines
        ? source_file + ":" + std::to_string(source_line)
        : source_file;
    sink->AddFileRange("sourcemap", name, col, length);
  }